

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t local_78;
  undefined1 local_6b;
  char cStack_6a;
  char local_69;
  char acStack_68 [5];
  char out [3];
  char hex [17];
  uchar in;
  dynbuf d;
  size_t length;
  byte *pbStack_20;
  int inlength_local;
  char *string_local;
  Curl_easy *data_local;
  
  if ((string == (char *)0x0) || (inlength < 0)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    if (inlength == 0) {
      local_78 = strlen(string);
    }
    else {
      local_78 = (size_t)inlength;
    }
    d.toobig = local_78;
    if (local_78 == 0) {
      data_local = (Curl_easy *)(*Curl_cstrdup)("");
    }
    else {
      Curl_dyn_init((dynbuf *)(hex + 0x10),local_78 * 3 + 1);
      pbStack_20 = (byte *)string;
      do {
        while( true ) {
          if (d.toobig == 0) {
            pcVar2 = Curl_dyn_ptr((dynbuf *)(hex + 0x10));
            return pcVar2;
          }
          hex[0xf] = *pbStack_20;
          if (((((0x2f < (byte)hex[0xf]) && ((byte)hex[0xf] < 0x3a)) ||
               ((0x60 < (byte)hex[0xf] && ((byte)hex[0xf] < 0x7b)))) ||
              ((((0x40 < (byte)hex[0xf] && ((byte)hex[0xf] < 0x5b)) || (hex[0xf] == 0x2d)) ||
               ((hex[0xf] == 0x2e || (hex[0xf] == 0x5f)))))) || (hex[0xf] == 0x7e)) break;
          builtin_strncpy(acStack_68,"01234",5);
          out[0] = '5';
          out[1] = '6';
          out[2] = '7';
          builtin_strncpy(hex,"89ABCDEF",9);
          _local_6b = CONCAT11(acStack_68[(int)(uint)(byte)hex[0xf] >> 4],0x25);
          local_69 = acStack_68[(int)((byte)hex[0xf] & 0xf)];
          CVar1 = Curl_dyn_addn((dynbuf *)(hex + 0x10),&local_6b,3);
          d.toobig = d.toobig - 1;
          pbStack_20 = pbStack_20 + 1;
          if (CVar1 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        CVar1 = Curl_dyn_addn((dynbuf *)(hex + 0x10),hex + 0xf,1);
        d.toobig = d.toobig - 1;
        pbStack_20 = pbStack_20 + 1;
      } while (CVar1 == CURLE_OK);
      data_local = (Curl_easy *)0x0;
    }
  }
  return (char *)data_local;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(!string || (inlength < 0))
    return NULL;

  length = (inlength ? (size_t)inlength : strlen(string));
  if(!length)
    return strdup("");

  Curl_dyn_init(&d, length * 3 + 1);

  while(length--) {
    /* treat the characters unsigned */
    unsigned char in = (unsigned char)*string++;

    if(ISUNRESERVED(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      const char hex[] = "0123456789ABCDEF";
      char out[3]={'%'};
      out[1] = hex[in >> 4];
      out[2] = hex[in & 0xf];
      if(Curl_dyn_addn(&d, out, 3))
        return NULL;
    }
  }

  return Curl_dyn_ptr(&d);
}